

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smfdur.cpp
# Opt level: O2

string * minutes_abi_cxx11_(string *__return_storage_ptr__,double seconds)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  double dVar4;
  undefined8 in_XMM3_Qb;
  string sStack_48;
  double local_28;
  undefined8 uStack_20;
  
  dVar4 = seconds - (double)((int)(seconds / 60.0) * 0x3c);
  uVar3 = -(ulong)(dVar4 - (double)(int)dVar4 < 0.5);
  local_28 = (double)(~uVar3 & (ulong)(double)((int)dVar4 + 1) | (ulong)(double)(int)dVar4 & uVar3);
  iVar1 = (int)(seconds / 60.0) + (uint)(local_28 == 60.0);
  uStack_20 = in_XMM3_Qb;
  if ((local_28 == 60.0) && (!NAN(local_28))) {
    local_28 = 0.0;
    uStack_20 = 0;
  }
  iVar2 = 0;
  if (0x3b < iVar1) {
    iVar2 = (iVar1 / 0x3c) * -0x3c;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0x76 < iVar1 + 0x3bU) {
    std::__cxx11::to_string(&sStack_48,iVar1 / 0x3c);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_48);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (iVar2 + iVar1 < 10) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  std::__cxx11::to_string(&sStack_48,iVar2 + iVar1);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_48);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_28 < 10.0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::to_string(&sStack_48,(int)local_28);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_48);
  return __return_storage_ptr__;
}

Assistant:

string minutes(double seconds) {
	int minutes = seconds / 60;
	seconds = seconds - minutes * 60;
	if (seconds - int(seconds) >= 0.5) {
		seconds = int(seconds) + 1;
	} else{
		seconds = int(seconds);
	}
	if (seconds == 60) {
		minutes++;
		seconds = 0;
	}
	int hours = minutes / 60;
	if (hours >= 1) {
		minutes = minutes - hours * 60;
	}

	string output;
	if (hours) {
		output += to_string(hours);
		output += ":";
		if (minutes < 10) {
			output += "0";
		}
	}
	output += to_string(minutes);
	output += ":";
	if (seconds < 10) {
		output += "0";
	}
	int isec = seconds;
	output += to_string(isec);
	return output;
}